

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxMemberIdentifier::FxMemberIdentifier
          (FxMemberIdentifier *this,FxExpression *left,FName *name,FScriptPosition *pos)

{
  int iVar1;
  
  iVar1 = name->Index;
  (this->super_FxIdentifier).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition
            (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,pos);
  (this->super_FxIdentifier).super_FxExpression.ValueType = (PType *)0x0;
  (this->super_FxIdentifier).super_FxExpression.isresolved = false;
  (this->super_FxIdentifier).super_FxExpression.NeedResult = true;
  (this->super_FxIdentifier).noglobal = false;
  (this->super_FxIdentifier).Identifier.Index = iVar1;
  (this->super_FxIdentifier).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxMemberIdentifier_007105f0;
  this->Object = left;
  (this->super_FxIdentifier).super_FxExpression.ExprType = EFX_MemberIdentifier;
  return;
}

Assistant:

FxMemberIdentifier::FxMemberIdentifier(FxExpression *left, FName name, const FScriptPosition &pos)
	: FxIdentifier(name, pos)
{
	Object = left;
	ExprType = EFX_MemberIdentifier;
}